

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkRenderPassInputAttachmentAspectCreateInfo *info)

{
  uint local_24;
  uint32_t i;
  VkRenderPassInputAttachmentAspectCreateInfo *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  Hasher::u32(h,info->aspectReferenceCount);
  for (local_24 = 0; local_24 < info->aspectReferenceCount; local_24 = local_24 + 1) {
    Hasher::u32(h,info->pAspectReferences[local_24].subpass);
    Hasher::u32(h,info->pAspectReferences[local_24].inputAttachmentIndex);
    Hasher::u32(h,info->pAspectReferences[local_24].aspectMask);
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *,
                              Hasher &h,
                              const VkRenderPassInputAttachmentAspectCreateInfo &info)
{
	h.u32(info.aspectReferenceCount);
	for (uint32_t i = 0; i < info.aspectReferenceCount; i++)
	{
		h.u32(info.pAspectReferences[i].subpass);
		h.u32(info.pAspectReferences[i].inputAttachmentIndex);
		h.u32(info.pAspectReferences[i].aspectMask);
	}
}